

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O2

string * __thiscall
ninx::lexer::Reader::read_until_limiter_abi_cxx11_(string *__return_storage_ptr__,Reader *this)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  allocator local_51;
  char current;
  undefined7 uStack_4f;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  pcVar1 = (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish != pcVar1) {
    (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
  }
  this_00 = &this->buffer;
  bVar2 = false;
LAB_0012cae3:
  if (((byte)this->stream[*(long *)(*(long *)this->stream + -0x18) + 0x20] & 5) != 0) {
LAB_0012cba3:
    _current = (char *)((ulong)_current & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(this_00,&current);
    std::__cxx11::string::string
              ((string *)&current,
               (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start,&local_51);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (_current == &local_40) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_38;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = _current;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    }
    __return_storage_ptr__->_M_string_length = local_48;
    local_48 = 0;
    local_40 = '\0';
    _current = &local_40;
    std::__cxx11::string::~string((string *)&current);
    return __return_storage_ptr__;
  }
  cVar3 = std::istream::peek();
  if (cVar3 == '\\') {
    std::istream::get();
  }
  else {
    bVar4 = is_limiter(cVar3);
    if (cVar3 != '-' && bVar4) goto LAB_0012cba3;
  }
  cVar3 = std::istream::get();
  _current = (char *)CONCAT71(uStack_4f,cVar3);
  if (cVar3 == '-') {
    iVar5 = std::istream::peek();
    if (9 < iVar5 - 0x30U) {
      std::istream::seekg((long)this->stream,~_S_beg);
      goto LAB_0012cba3;
    }
    cVar3 = current;
  }
  else if (cVar3 == -1) goto LAB_0012cba3;
  if (cVar3 != '\n') goto LAB_0012cb6c;
  this->line_number = this->line_number + 1;
  goto LAB_0012cb80;
LAB_0012cb6c:
  iVar5 = isspace((int)cVar3);
  bVar4 = (bool)(iVar5 != 0 & bVar2);
  bVar2 = true;
  if (!bVar4) {
LAB_0012cb80:
    std::vector<char,_std::allocator<char>_>::push_back(this_00,&current);
    bVar2 = cVar3 == '\n';
  }
  goto LAB_0012cae3;
}

Assistant:

std::string ninx::lexer::Reader::read_until_limiter() {
    this->buffer.clear();

    bool line_started {false};  // Used to discard indentations

    while (stream) {
        // Check if the next char is one of the limiting ones
        char next_char = static_cast<char>(stream.peek());
        if (next_char == '\\') {   // Escaping control
            stream.get();  // Discard the escaping char, and avoid limiter check so char is considered as text
        }else{
            if (is_limiter(next_char) && next_char != '-') {  // Exception is for negative number handling
                break;
            }
        }

        // Read the current char
        char current = static_cast<char>(stream.get());
        if (current == -1) {
            break;
        }

        if (current == '-' && !isdigit(stream.peek())) {  // Not a negative number, rollback
            this->stream.seekg(-1, std::ios_base::cur);
            break;
        }

        if (current == '\n') { // Increment the line count if a newline was found
            this->increment_line();
            line_started = true;
        }else{
            if (!isspace(current)) {
                line_started = false;
            }
        }

        // Allow newlines and chars only if they are not the first space ( indentation )
        if ( current == '\n' || !line_started ) {
            this->buffer.push_back(current);
        }
    }

    this->buffer.push_back(0);

    return std::move(std::string{buffer.data()});
}